

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O2

void __thiscall
QtPromisePrivate::PromiseDataBase<QVariant,_void_(const_QVariant_&)>::addHandler
          (PromiseDataBase<QVariant,_void_(const_QVariant_&)> *this,
          function<void_(const_QVariant_&)> *handler)

{
  QWriteLocker lock;
  QWriteLocker local_50;
  QThread *local_48;
  pair<QPointer<QThread>,_std::function<void_(const_QVariant_&)>_> local_40;
  
  local_50.q_val = (quintptr)&this->m_lock;
  QWriteLocker::relock(&local_50);
  local_48 = (QThread *)QThread::currentThread();
  std::pair<QPointer<QThread>,_std::function<void_(const_QVariant_&)>_>::
  pair<QThread_*,_std::function<void_(const_QVariant_&)>,_true>(&local_40,&local_48,handler);
  QList<std::pair<QPointer<QThread>,std::function<void(QVariant_const&)>>>::
  emplaceBack<std::pair<QPointer<QThread>,std::function<void(QVariant_const&)>>>
            ((QList<std::pair<QPointer<QThread>,std::function<void(QVariant_const&)>>> *)
             &this->m_handlers,&local_40);
  std::pair<QPointer<QThread>,_std::function<void_(const_QVariant_&)>_>::~pair(&local_40);
  QWriteLocker::~QWriteLocker(&local_50);
  return;
}

Assistant:

void addHandler(std::function<F> handler)
    {
        QWriteLocker lock{&m_lock};
        m_handlers.append({QThread::currentThread(), std::move(handler)});
    }